

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_set.c
# Opt level: O1

int mpt_string_set(char **ptr,char *data,int len)

{
  size_t sVar1;
  char *pcVar2;
  
  if (data == (char *)0x0) {
    len = 0;
  }
  else if (len < 0) {
    sVar1 = strlen(data);
    len = (int)sVar1;
  }
  pcVar2 = *ptr;
  if (len == 0) {
    free(pcVar2);
    *ptr = (char *)0x0;
  }
  else if (pcVar2 != data) {
    pcVar2 = (char *)realloc(pcVar2,(long)(len + 1));
    if (pcVar2 != (char *)0x0) {
      memcpy(pcVar2,data,(long)len);
      *ptr = pcVar2;
      pcVar2[len] = '\0';
      return len;
    }
    return -4;
  }
  return 0;
}

Assistant:

extern int mpt_string_set(char **ptr, const char *data, int len)
{
	char *txt;
	
	if (!data) {
		len = 0;
	}
	else if (len < 0) {
		len = strlen(data);
	}
	if (!len) {
		free(*ptr);
		*ptr = 0;
		return 0;
	}
	if (data == *ptr) {
		return 0;
	}
	if (!(txt = realloc(*ptr, len + 1))) {
		return MPT_ERROR(BadOperation);
	}
	*ptr = memcpy(txt, data, len);
	txt[len] = 0;
	
	return len;
}